

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::SetProperty
          (JavascriptProxy *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  bool bVar1;
  BOOL BVar2;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  HostScriptContext *this_00;
  undefined1 local_b0 [8];
  PropertyDescriptor resultDescriptor;
  ImplicitCallFlags saveImplicitCallFlags;
  ScriptContext *requestContext;
  ThreadContext *threadContext;
  PropertyDescriptor proxyPropertyDescriptor;
  PropertyValueInfo *info_local;
  PropertyOperationFlags flags_local;
  Var value_local;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  
  proxyPropertyDescriptor._40_8_ = info;
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar4,0xc00,pSVar3,(PVOID)0x0);
  PropertyValueInfo::SetNoCache
            ((PropertyValueInfo *)proxyPropertyDescriptor._40_8_,(RecyclableObject *)this);
  PropertyValueInfo::DisablePrototypeCache
            ((PropertyValueInfo *)proxyPropertyDescriptor._40_8_,(RecyclableObject *)this);
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&threadContext);
  pSVar3 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  this_00 = ThreadContext::GetPreviousHostScriptContext(pTVar4);
  pSVar3 = HostScriptContext::GetScriptContext(this_00);
  resultDescriptor._47_1_ = ThreadContext::GetImplicitCallFlags(pTVar4);
  ThreadContext::SetImplicitCallFlags(pTVar4,resultDescriptor._47_1_ | ImplicitCall_Accessor);
  BVar2 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                    ((RecyclableObject *)this,propertyId,pSVar3,(PropertyDescriptor *)&threadContext
                    );
  if (BVar2 == 0) {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_b0);
    PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_b0,true);
    PropertyDescriptor::SetWritable((PropertyDescriptor *)local_b0,true);
    PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_b0,true);
    PropertyDescriptor::SetValue((PropertyDescriptor *)local_b0,value);
    this_local._4_4_ =
         Js::JavascriptOperators::DefineOwnPropertyDescriptor
                   ((RecyclableObject *)this,propertyId,(PropertyDescriptor *)local_b0,true,pSVar3,
                    flags);
  }
  else {
    bVar1 = PropertyDescriptor::IsAccessorDescriptor((PropertyDescriptor *)&threadContext);
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      bVar1 = PropertyDescriptor::WritableSpecified((PropertyDescriptor *)&threadContext);
      if ((!bVar1) ||
         (bVar1 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&threadContext), bVar1)) {
        PropertyDescriptor::SetValue((PropertyDescriptor *)&threadContext,value);
        PropertyDescriptor::SetOriginal((PropertyDescriptor *)&threadContext,(Var)0x0);
        this_local._4_4_ =
             Js::JavascriptOperators::DefineOwnPropertyDescriptor
                       ((RecyclableObject *)this,propertyId,(PropertyDescriptor *)&threadContext,
                        true,pSVar3,flags);
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // This is the second half of [[set]] where when the handler does not specified [[set]] so we forward to [[set]] on target
        // with receiver as the proxy.
        //c.Let existingDescriptor be the result of calling the[[GetOwnProperty]] internal method of Receiver with argument P.
        //d.ReturnIfAbrupt(existingDescriptor).
        //e.If existingDescriptor is not undefined, then
        //    i.Let valueDesc be the PropertyDescriptor{ [[Value]]: V }.
        //    ii.Return the result of calling the[[DefineOwnProperty]] internal method of Receiver with arguments P and valueDesc.
        //f.Else Receiver does not currently have a property P,
        //    i.Return the result of performing CreateDataProperty(Receiver, P, V).
        // We can't cache the property at this time. both target and handler can be changed outside of the proxy, so the inline cache needs to be
        // invalidate when target, handler, or handler prototype has changed. We don't have a way to achieve this yet.
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either

        PropertyDescriptor proxyPropertyDescriptor;

        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        // Set implicit call flag so we bailout and not do copy-prop on field

        Js::ImplicitCallFlags saveImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->SetImplicitCallFlags((Js::ImplicitCallFlags)(saveImplicitCallFlags | ImplicitCall_Accessor));

        if (!JavascriptOperators::GetOwnPropertyDescriptor(this, propertyId, requestContext, &proxyPropertyDescriptor))
        {
            PropertyDescriptor resultDescriptor;
            resultDescriptor.SetConfigurable(true);
            resultDescriptor.SetWritable(true);
            resultDescriptor.SetEnumerable(true);
            resultDescriptor.SetValue(value);
            return Js::JavascriptOperators::DefineOwnPropertyDescriptor(this, propertyId, resultDescriptor, true, requestContext, flags);
        }
        else
        {
            // ES2017 Spec'd (9.1.9.1):
            // If existingDescriptor is not undefined, then
            //    If IsAccessorDescriptor(existingDescriptor) is true, return false.
            //    If existingDescriptor.[[Writable]] is false, return false.

            if (proxyPropertyDescriptor.IsAccessorDescriptor())
            {
                return FALSE;
            }

            if (proxyPropertyDescriptor.WritableSpecified() && !proxyPropertyDescriptor.IsWritable())
            {
                return FALSE;
            }

            proxyPropertyDescriptor.SetValue(value);
            proxyPropertyDescriptor.SetOriginal(nullptr);
            return Js::JavascriptOperators::DefineOwnPropertyDescriptor(this, propertyId, proxyPropertyDescriptor, true, requestContext, flags);
        }
    }